

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O0

Read<double> __thiscall
Omega_h::Mesh::sync_subset_array<double>
          (Mesh *this,Int ent_dim,Read<double> *a_data,LOs *a2e,double default_val,Int width)

{
  bool bVar1;
  LO nb;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar2;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  Int in_R9D;
  Read<double> RVar3;
  Read<double> local_d0;
  Read<int> local_c0;
  Write<double> local_b0;
  Read<double> local_a0;
  undefined1 local_90 [64];
  undefined1 local_50 [8];
  Read<double> e_data;
  Int width_local;
  double default_val_local;
  LOs *a2e_local;
  Read<double> *a_data_local;
  Int ent_dim_local;
  Mesh *this_local;
  
  e_data.write_.shared_alloc_.direct_ptr._4_4_ = in_R9D;
  bVar1 = could_be_shared((Mesh *)CONCAT44(in_register_00000034,ent_dim),(Int)a_data);
  if (bVar1) {
    Read<double>::Read((Read<double> *)(local_90 + 0x30),(Read<double> *)a2e);
    Read<int>::Read((Read<int> *)(local_90 + 0x20),(Read<int> *)CONCAT44(in_register_00000084,width)
                   );
    nb = nents((Mesh *)CONCAT44(in_register_00000034,ent_dim),(Int)a_data);
    map_onto<double>((Omega_h *)local_50,(Read<signed_char> *)(local_90 + 0x30),
                     (LOs *)(local_90 + 0x20),nb,default_val,
                     e_data.write_.shared_alloc_.direct_ptr._4_4_);
    Read<int>::~Read((Read<int> *)(local_90 + 0x20));
    Read<double>::~Read((Read<double> *)(local_90 + 0x30));
    Read<double>::Read(&local_a0,(Read<double> *)local_50);
    sync_array<double>((Mesh *)local_90,ent_dim,(Read<double> *)((ulong)a_data & 0xffffffff),
                       (Int)&local_a0);
    Read<double>::operator=((Read<double> *)local_50,(Read<double> *)local_90);
    Read<double>::~Read((Read<double> *)local_90);
    Read<double>::~Read(&local_a0);
    Read<int>::Read(&local_c0,(Read<int> *)CONCAT44(in_register_00000084,width));
    Read<double>::Read(&local_d0,(Read<double> *)local_50);
    unmap<double>((Omega_h *)&local_b0,&local_c0,(Read<signed_char> *)&local_d0,
                  e_data.write_.shared_alloc_.direct_ptr._4_4_);
    Read<double>::Read((Read<double> *)this,&local_b0);
    Write<double>::~Write(&local_b0);
    Read<double>::~Read(&local_d0);
    Read<int>::~Read(&local_c0);
    Read<double>::~Read((Read<double> *)local_50);
    pvVar2 = extraout_RDX_00;
  }
  else {
    Read<double>::Read((Read<double> *)this,(Read<signed_char> *)a2e);
    pvVar2 = extraout_RDX;
  }
  RVar3.write_.shared_alloc_.direct_ptr = pvVar2;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<double>)RVar3.write_.shared_alloc_;
}

Assistant:

Read<T> Mesh::sync_subset_array(
    Int ent_dim, Read<T> a_data, LOs a2e, T default_val, Int width) {
  if (!could_be_shared(ent_dim)) return a_data;
  auto e_data = map_onto(a_data, a2e, nents(ent_dim), default_val, width);
  e_data = sync_array(ent_dim, e_data, width);
  return unmap(a2e, e_data, width);
}